

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::clearColorReference
               (Surface *ref,float red,float green,float blue,float alpha)

{
  Vec4 local_40;
  PixelBufferAccess local_30;
  
  tcu::Surface::getAccess(&local_30,ref);
  local_40.m_data[3] = 1.0;
  local_40.m_data[0] = red;
  local_40.m_data[1] = green;
  local_40.m_data[2] = blue;
  tcu::clear(&local_30,&local_40);
  return;
}

Assistant:

void clearColorReference (tcu::Surface* ref, float red, float green, float blue, float alpha)
{
	tcu::clear(ref->getAccess(), tcu::Vec4(red, green, blue, alpha));
}